

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateMessageDefinitions
          (FileGenerator *this,Printer *printer)

{
  size_type sVar1;
  reference ppMVar2;
  int local_1c;
  int i;
  Printer *printer_local;
  FileGenerator *this_local;
  
  local_1c = 0;
  while( true ) {
    sVar1 = std::
            vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
            ::size(&this->message_generators_);
    if (sVar1 <= (ulong)(long)local_1c) break;
    if (0 < local_1c) {
      io::Printer::Print(printer,"\n");
      io::Printer::Print(printer,
                         "// -------------------------------------------------------------------\n")
      ;
      io::Printer::Print(printer,"\n");
    }
    ppMVar2 = std::
              vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
              ::operator[](&this->message_generators_,(long)local_1c);
    MessageGenerator::GenerateClassDefinition(*ppMVar2,printer);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void FileGenerator::GenerateMessageDefinitions(io::Printer* printer) {
  // Generate class definitions.
  for (int i = 0; i < message_generators_.size(); i++) {
    if (i > 0) {
      printer->Print("\n");
      printer->Print(kThinSeparator);
      printer->Print("\n");
    }
    message_generators_[i]->GenerateClassDefinition(printer);
  }
}